

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O3

string * __thiscall
BasePort::ProtocolString_abi_cxx11_
          (string *__return_storage_ptr__,BasePort *this,ProtocolType protocol)

{
  char *pcVar1;
  int iVar2;
  char *pcVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  iVar2 = (int)this;
  if (iVar2 == 2) {
    pcVar3 = "broadcast-query-read-write";
    pcVar1 = "";
  }
  else if (iVar2 == 1) {
    pcVar3 = "sequential-read-broadcast-write";
    pcVar1 = "";
  }
  else if (iVar2 == 0) {
    pcVar3 = "sequential-read-write";
    pcVar1 = "";
  }
  else {
    pcVar3 = "Unknown";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string BasePort::ProtocolString(ProtocolType protocol)
{
    if (protocol == PROTOCOL_SEQ_RW) {
        return std::string("sequential-read-write");
    } else if (protocol == PROTOCOL_SEQ_R_BC_W) {
        return std::string("sequential-read-broadcast-write");
    } else if (protocol == PROTOCOL_BC_QRW) {
        return std::string("broadcast-query-read-write");
    }
    return std::string("Unknown");
}